

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O2

double dipole_sample(double a,double b,int *seed)

{
  double *pdVar1;
  double dVar2;
  double dVar3;
  
  dVar2 = sin(a);
  dVar3 = cos(a);
  pdVar1 = disk_sample(dVar2 * b,b * dVar3,1.0,seed);
  dVar2 = *pdVar1;
  dVar3 = pdVar1[1];
  operator_delete__(pdVar1);
  return dVar2 / dVar3;
}

Assistant:

double dipole_sample ( double a, double b, int &seed )

//****************************************************************************80
//
//  Purpose:
//
//    DIPOLE_SAMPLE samples the Dipole PDF.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    14 October 2004
//
//  Author:
//
//    John Burkardt
//
//  Reference:
//
//    Robert Knop,
//    Algorithm 441,
//    ACM Transactions on Mathematical Software.
//
//  Parameters:
//
//    Input, double A, B, the parameters of the PDF.
//    A is arbitrary, but represents an angle, so only 0 <= A <= 2 * PI
//      is interesting,
//    and -1.0 <= B <= 1.0.
//
//    Input/output, int &SEED, a seed for the random number generator.
//
//    Output, double DIPOLE_SAMPLE, a sample of the PDF.
//
{
  double a2;
  double b2;
  double c2;
  double x;
  double *xc;
//
//  Find (X1,X2) at random in a circle.
//
  a2 = b * sin ( a );
  b2 = b * cos ( a );
  c2 = 1.0;

  xc = disk_sample ( a2, b2, c2, seed );
//
//  The dipole variate is the ratio X1 / X2.
//
  x = xc[0] / xc[1];

  delete [] xc;

  return x;
}